

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchCore.c
# Opt level: O3

void Dch_ComputeEquivalences(Aig_Man_t *pAig,Dch_Pars_t *pPars)

{
  int iVar1;
  Dch_Man_t *p;
  Dch_Cla_t *pDVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  timespec ts;
  timespec local_38;
  
  iVar1 = clock_gettime(3,&local_38);
  lVar6 = 1;
  lVar4 = 1;
  if (-1 < iVar1) {
    lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_38.tv_nsec),8);
    lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_38.tv_sec * -1000000;
  }
  Aig_ManRandom(1);
  p = Dch_ManCreate(pAig,pPars);
  iVar1 = clock_gettime(3,&local_38);
  if (-1 < iVar1) {
    lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_38.tv_nsec),8);
    lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_38.tv_sec * -1000000;
  }
  pDVar2 = Dch_CreateCandEquivClasses(pAig,pPars->nWords,pPars->fVerbose);
  p->ppClasses = pDVar2;
  iVar1 = clock_gettime(3,&local_38);
  lVar5 = -1;
  lVar3 = -1;
  if (-1 < iVar1) {
    lVar3 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
  }
  p->timeSimInit = lVar3 + lVar6;
  iVar1 = Dch_ClassesLitNum(p->ppClasses);
  p->nLits = iVar1;
  Dch_ManSweep(p);
  iVar1 = clock_gettime(3,&local_38);
  if (-1 < iVar1) {
    lVar5 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
  }
  p->timeTotal = lVar5 + lVar4;
  Dch_ManStop(p);
  return;
}

Assistant:

void Dch_ComputeEquivalences( Aig_Man_t * pAig, Dch_Pars_t * pPars )
{
    Dch_Man_t * p;
    abctime clk, clkTotal = Abc_Clock();
    // reset random numbers
    Aig_ManRandom(1);
    // start the choicing manager
    p = Dch_ManCreate( pAig, pPars );
    // compute candidate equivalence classes
clk = Abc_Clock(); 
    p->ppClasses = Dch_CreateCandEquivClasses( pAig, pPars->nWords, pPars->fVerbose );
p->timeSimInit = Abc_Clock() - clk;
//    Dch_ClassesPrint( p->ppClasses, 0 );
    p->nLits = Dch_ClassesLitNum( p->ppClasses );
    // perform SAT sweeping
    Dch_ManSweep( p );
    // free memory ahead of time
p->timeTotal = Abc_Clock() - clkTotal;
    Dch_ManStop( p );
}